

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int eatfood(void)

{
  boolean bVar1;
  int iVar2;
  bool local_11;
  uint local_10;
  int local_c;
  int crumbs;
  
  if (victual.piece == (obj *)0x0) {
LAB_001ca0c7:
    do_reset_eat();
    local_c = 0;
  }
  else {
    if ((victual.piece)->where != '\x03') {
      bVar1 = obj_here(victual.piece,(int)u.ux,(int)u.uy);
      if (bVar1 == '\0') goto LAB_001ca0c7;
    }
    local_11 = true;
    if (((youmonst.data)->mlet != '0') && (local_11 = true, ((youmonst.data)->mflags2 & 0x100) == 0)
       ) {
      local_11 = youmonst.data == mons + 0x85;
    }
    if ((uint)local_11 == (*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1)) {
      if (((byte)victual._20_1_ >> 2 & 1) == 0) {
        local_c = 0;
      }
      else {
        victual.usedtime = victual.usedtime + 1;
        if (victual.reqtime < victual.usedtime) {
          local_10 = (victual.piece)->oeaten;
          if ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) != 0) {
            local_10 = local_10 - ((uint)mons[(victual.piece)->corpsenm].cnutrit << 2) / 5;
          }
          if (0 < (int)local_10) {
            lesshungry(local_10);
            (victual.piece)->oeaten = (victual.piece)->oeaten - local_10;
          }
          done_eating('\x01');
          local_c = 0;
        }
        else {
          iVar2 = bite();
          if (iVar2 == 0) {
            local_c = 1;
          }
          else {
            local_c = 0;
          }
        }
      }
    }
    else {
      do_reset_eat();
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

static int eatfood(void)	/* called each move during eating process */
{
	if (!victual.piece ||
	 (!carried(victual.piece) && !obj_here(victual.piece, u.ux, u.uy))) {
		/* maybe it was stolen? */
		do_reset_eat();
		return 0;
	}
	if (is_vampiric(youmonst.data) != victual.piece->odrained) {
	    /* polymorphed while eating/draining */
	    do_reset_eat();
	    return 0;
	}
	if (!victual.eating) return 0;

	if (++victual.usedtime <= victual.reqtime) {
	    if (bite()) return 0;
	    return 1;	/* still busy */
	} else {	/* done */
	    int crumbs = victual.piece->oeaten;	/* the last crumbs */
	    if (victual.piece->odrained)
		crumbs -= drainlevel(victual.piece);
	    if (crumbs > 0) {
		lesshungry(crumbs);
		victual.piece->oeaten -= crumbs;
	    }
	    done_eating(TRUE);
	    return 0;
	}
}